

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Persistence_heat_maps.h
# Opt level: O0

double __thiscall
Gudhi::Persistence_representations::
Persistence_heat_maps<Gudhi::Persistence_representations::constant_scaling_function>::
compute_scalar_product
          (Persistence_heat_maps<Gudhi::Persistence_representations::constant_scaling_function>
           *this,Persistence_heat_maps<Gudhi::Persistence_representations::constant_scaling_function>
                 *second)

{
  double dVar1;
  double dVar2;
  pair<double,_double> __args;
  pair<double,_double> __args_1;
  bool bVar3;
  undefined8 *puVar4;
  size_type sVar5;
  const_reference pvVar6;
  const_reference pvVar7;
  size_type sVar8;
  const_reference pvVar9;
  double dVar10;
  pair<double,_double> pj;
  int j_1;
  pair<double,_double> pi;
  Persistence_heat_maps<Gudhi::Persistence_representations::constant_scaling_function> *pPStack_48;
  int i_1;
  double kernel_val;
  int num_pts2;
  int num_pts1;
  size_t j;
  size_t i;
  double scalar_prod;
  Persistence_heat_maps<Gudhi::Persistence_representations::constant_scaling_function> *second_local
  ;
  Persistence_heat_maps<Gudhi::Persistence_representations::constant_scaling_function> *this_local;
  
  if ((this->discrete & 1U) == 0) {
    sVar5 = std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>::
            size(&this->interval);
    sVar8 = std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>::
            size(&second->interval);
    pPStack_48 = (Persistence_heat_maps<Gudhi::Persistence_representations::constant_scaling_function>
                  *)0x0;
    for (pi.second._4_4_ = 0; pi.second._4_4_ < (int)sVar5; pi.second._4_4_ = pi.second._4_4_ + 1) {
      pvVar9 = std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>::
               operator[](&this->interval,(long)pi.second._4_4_);
      __args.first = pvVar9->first;
      __args.second = pvVar9->second;
      for (pj.second._4_4_ = 0; pj.second._4_4_ < (int)sVar8; pj.second._4_4_ = pj.second._4_4_ + 1)
      {
        pvVar9 = std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                 ::operator[](&second->interval,(long)pj.second._4_4_);
        __args_1.first = pvVar9->first;
        __args_1.second = pvVar9->second;
        pvVar7 = std::vector<double,_std::allocator<double>_>::operator[]
                           (&this->weights,(long)pi.second._4_4_);
        dVar1 = *pvVar7;
        pvVar7 = std::vector<double,_std::allocator<double>_>::operator[]
                           (&second->weights,(long)pj.second._4_4_);
        dVar2 = *pvVar7;
        dVar10 = std::function<double_(std::pair<double,_double>,_std::pair<double,_double>)>::
                 operator()(&this->kernel,__args,__args_1);
        pPStack_48 = (Persistence_heat_maps<Gudhi::Persistence_representations::constant_scaling_function>
                      *)(dVar1 * dVar2 * dVar10 + (double)pPStack_48);
      }
    }
    this_local = pPStack_48;
  }
  else {
    bVar3 = check_if_the_same(this,second);
    if (!bVar3) {
      std::operator<<((ostream *)&std::cerr,
                      "The persistence images are of non compatible sizes. We cannot therefore compute distance between them. The program will now terminate"
                     );
      puVar4 = (undefined8 *)__cxa_allocate_exception(8);
      *puVar4 = "The persistence images are of non compatible sizes. The program will now terminate"
      ;
      __cxa_throw(puVar4,&char_const*::typeinfo,0);
    }
    i = 0;
    j = 0;
    while( true ) {
      sVar5 = std::
              vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
              ::size(&this->heat_map);
      if (j == sVar5) break;
      _num_pts2 = 0;
      while( true ) {
        pvVar6 = std::
                 vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                 ::operator[](&this->heat_map,j);
        sVar5 = std::vector<double,_std::allocator<double>_>::size(pvVar6);
        if (_num_pts2 == sVar5) break;
        pvVar6 = std::
                 vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                 ::operator[](&this->heat_map,j);
        pvVar7 = std::vector<double,_std::allocator<double>_>::operator[](pvVar6,_num_pts2);
        dVar1 = *pvVar7;
        pvVar6 = std::
                 vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                 ::operator[](&second->heat_map,j);
        pvVar7 = std::vector<double,_std::allocator<double>_>::operator[](pvVar6,_num_pts2);
        i = (size_t)(dVar1 * *pvVar7 + (double)i);
        _num_pts2 = _num_pts2 + 1;
      }
      j = j + 1;
    }
    this_local = (Persistence_heat_maps<Gudhi::Persistence_representations::constant_scaling_function>
                  *)i;
  }
  return (double)this_local;
}

Assistant:

double Persistence_heat_maps<Scalling_of_kernels>::compute_scalar_product(const Persistence_heat_maps& second) const {
  if (discrete) {
    // first we need to check if (*this) and second are defined on the same domain and have the same dimensions:
    if (!this->check_if_the_same(second)) {
      std::cerr << "The persistence images are of non compatible sizes. We cannot therefore compute distance between "
                   "them. The program will now terminate";
      throw "The persistence images are of non compatible sizes. The program will now terminate";
    }

    // if we are here, we know that the two persistence images are defined on the same domain, so we can start computing
    // their scalar product:
    double scalar_prod = 0;
    for (size_t i = 0; i != this->heat_map.size(); ++i) {
      for (size_t j = 0; j != this->heat_map[i].size(); ++j) {
        scalar_prod += this->heat_map[i][j] * second.heat_map[i][j];
      }
    }
    return scalar_prod;
  } else {
    int num_pts1 = this->interval.size();
    int num_pts2 = second.interval.size();
    double kernel_val = 0;
    for (int i = 0; i < num_pts1; i++) {
      std::pair<double, double> pi = this->interval[i];
      for (int j = 0; j < num_pts2; j++) {
        std::pair<double, double> pj = second.interval[j];
        kernel_val += this->weights[i] * second.weights[j] * this->kernel(pi, pj);
      }
    }
    return kernel_val;
  }
}